

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSubContractResource::~IfcSubContractResource
          (IfcSubContractResource *this,void **vtt)

{
  void **vtt_local;
  IfcSubContractResource *this_local;
  
  *(void **)&this->super_IfcConstructionResource = *vtt;
  *(void **)(&(this->super_IfcConstructionResource).field_0x0 +
            *(long *)(*(long *)&this->super_IfcConstructionResource + -0x18)) = vtt[0x21];
  *(void **)&(this->super_IfcConstructionResource).field_0x88 = vtt[0x22];
  *(void **)&(this->super_IfcConstructionResource).field_0x98 = vtt[0x23];
  *(void **)&(this->super_IfcConstructionResource).field_0xd0 = vtt[0x24];
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x25];
  *(void **)&(this->super_IfcConstructionResource).field_0x178 = vtt[0x26];
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Maybe(&this->JobDescription);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::~Maybe
            ((Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_> *)
             &(this->super_IfcConstructionResource).field_0x188);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSubContractResource,_2UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSubContractResource,_2UL> *)
             &(this->super_IfcConstructionResource).field_0x178,vtt + 0x1f);
  IfcConstructionResource::~IfcConstructionResource(&this->super_IfcConstructionResource,vtt + 1);
  return;
}

Assistant:

IfcSubContractResource() : Object("IfcSubContractResource") {}